

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

int ComputeQCostBits(Cube *p)

{
  varvalue vVar1;
  int iVar2;
  int nNegs;
  int Var;
  
  iVar2 = 0;
  nNegs = 0;
  for (Var = 0; Var < g_CoverInfo.nVarsIn; Var = Var + 1) {
    vVar1 = GetVar(p,Var);
    if (vVar1 == VAR_POS) {
      iVar2 = iVar2 + 1;
    }
    else if (vVar1 == VAR_NEG) {
      nNegs = nNegs + 1;
    }
  }
  iVar2 = GetQCost(iVar2 + nNegs,nNegs);
  return iVar2;
}

Assistant:

int ComputeQCostBits( Cube * p )
{
    extern varvalue GetVar( Cube* pC, int Var );
    int v, nLits = 0, nLitsN = 0;
    for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
    {
        int Value = GetVar( p, v );
        if ( Value == VAR_NEG )
            nLitsN++;
        else if ( Value == VAR_POS )
            nLits++;
    }
    nLits += nLitsN;
    return GetQCost( nLits, nLitsN );
}